

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O0

char * cmSHA512_End(SHA_CTX *context,char *buffer)

{
  char *pcVar1;
  int local_64;
  sha_byte **ppsStack_60;
  int i;
  sha_byte *d;
  sha_byte digest [64];
  char *buffer_local;
  SHA_CTX *context_local;
  
  ppsStack_60 = &d;
  digest._56_8_ = buffer;
  if (context != (SHA_CTX *)0x0) {
    if (buffer == (char *)0x0) {
      memset(context,0,0xd0);
    }
    else {
      cmSHA512_Final((sha_byte *)&d,context);
      for (local_64 = 0; local_64 < 0x40; local_64 = local_64 + 1) {
        pcVar1 = (char *)(digest._56_8_ + 1);
        *(char *)digest._56_8_ = sha_hex_digits[(int)(*(byte *)ppsStack_60 & 0xf0) >> 4];
        digest._56_8_ = digest._56_8_ + 2;
        *pcVar1 = sha_hex_digits[(int)(*(byte *)ppsStack_60 & 0xf)];
        ppsStack_60 = (sha_byte **)((long)ppsStack_60 + 1);
      }
      *(undefined1 *)digest._56_8_ = 0;
    }
    memset(&d,0,0x40);
    return (char *)digest._56_8_;
  }
  __assert_fail("context != (SHA_CTX*)0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cm_sha2.c"
                ,0x5f0,"char *cmSHA512_End(SHA_CTX *, char *)");
}

Assistant:

char *SHA512_End(SHA_CTX* context, char buffer[]) {
	sha_byte	digest[SHA512_DIGEST_LENGTH], *d = digest;
	int		i;

	/* Sanity check: */
	assert(context != (SHA_CTX*)0);

	if (buffer != (char*)0) {
		SHA512_Final(digest, context);

		for (i = 0; i < SHA512_DIGEST_LENGTH; i++) {
			*buffer++ = sha_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		MEMSET_BZERO(context, sizeof(*context));
	}
	MEMSET_BZERO(digest, SHA512_DIGEST_LENGTH);
	return buffer;
}